

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.cpp
# Opt level: O3

char * __thiscall crypto::arc4::crypt(arc4 *this,char *__key,char *__salt)

{
  uint8_t uVar1;
  char *in_RAX;
  char *in_RCX;
  ulong uVar2;
  uchar __tmp;
  ulong uVar3;
  
  if (in_RCX != (char *)0x0) {
    in_RAX = (char *)0x0;
    do {
      uVar2 = (ulong)((int)this->a + 1U & 0xff);
      this->a = uVar2;
      uVar1 = this->state[uVar2];
      uVar3 = (ulong)(byte)((char)this->b + uVar1);
      this->b = uVar3;
      this->state[uVar2] = this->state[uVar3];
      this->state[uVar3] = uVar1;
      __salt[(long)in_RAX] = __key[(long)in_RAX] ^ this->state[(byte)(uVar1 + this->state[uVar2])];
      in_RAX = in_RAX + 1;
    } while (in_RCX != in_RAX);
  }
  return in_RAX;
}

Assistant:

void arc4::crypt(const char * in, char * out, size_t length) {
	
	for(size_t i = 0; i < length; i++) {
		update();
		out[i] = char(state[size_t(state[a] + state[b]) % sizeof(state)] ^ boost::uint8_t(in[i]));
	}
	
}